

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O1

void pbrt::anon_class_1_0_00000001::__invoke(StatsAccumulator *accum)

{
  long in_FS_OFFSET;
  
  StatsAccumulator::ReportCounter
            (accum,"Scene/Object instances used",*(int64_t *)(in_FS_OFFSET + -8));
  *(undefined8 *)(in_FS_OFFSET + -8) = 0;
  return;
}

Assistant:

ParsedScene::ParsedScene() {
    // Set scene defaults
    camera.name = "perspective";
    sampler.name = "pmj02bn";
    filter.name = "gaussian";
    integrator.name = "volpath";

    ParameterDictionary dict({}, RGBColorSpace::sRGB);
    materials.push_back(SceneEntity("diffuse", dict, {}));
    accelerator.name = "bvh";
    film.name = "rgb";
    film.parameters = ParameterDictionary({}, RGBColorSpace::sRGB);
}